

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::handleClose(TcpConnection *this)

{
  self *psVar1;
  LogStream *this_00;
  char *str;
  SourceFile file;
  undefined1 local_ff8 [8];
  TcpConnectionPtr guardThis;
  undefined1 local_28 [12];
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_28,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    Logger::Logger((Logger *)local_ff8,file,0x197,TRACE,"handleClose");
    psVar1 = LogStream::operator<<((LogStream *)&guardThis,"fd = ");
    this_00 = LogStream::operator<<
                        (psVar1,((this->m_channel)._M_t.
                                 super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                                 .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)
                                ->m_fd);
    psVar1 = LogStream::operator<<(this_00," state = ");
    str = stateToString(this);
    LogStream::operator<<(psVar1,str);
    Logger::~Logger((Logger *)local_ff8);
  }
  if ((this->m_state & ~kConnecting) == kConnected) {
    this->m_state = kDisconnected;
    Channel::disableAll((this->m_channel)._M_t.
                        super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                        .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl);
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_ff8,
               (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    if ((this->m_connectionCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
                (&this->m_connectionCallback,(shared_ptr<sznet::net::TcpConnection> *)local_ff8);
    }
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
              (&this->m_closeCallback,(shared_ptr<sznet::net::TcpConnection> *)local_ff8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guardThis);
    return;
  }
  __assert_fail("m_state == kConnected || m_state == kDisconnecting",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x198,"void sznet::net::TcpConnection::handleClose()");
}

Assistant:

void TcpConnection::handleClose()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "fd = " << m_channel->fd() << " state = " << stateToString();
	assert(m_state == kConnected || m_state == kDisconnecting);
	// we don't close fd, leave it to dtor, so we can find leaks easily.
	setState(kDisconnected);
	m_channel->disableAll();

	// ��ֹ��ǰ�ͷţ����ɲ���Ԥ��������
	TcpConnectionPtr guardThis(shared_from_this());
	if (m_connectionCallback)
	{
		m_connectionCallback(guardThis);
	}
	// must be the last line
	m_closeCallback(guardThis);
}